

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

uint Kit_TruthSemiCanonicize(uint *pInOut,uint *pAux,int nVars,char *pCanonPerm)

{
  ushort *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  uint uVar27;
  char cVar28;
  ulong uVar29;
  ulong uVar30;
  uint *pIn;
  uint uVar31;
  uint uVar32;
  bool bVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar45;
  int iVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  long lVar46;
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar68;
  undefined1 auVar66 [16];
  int iVar69;
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar83;
  int iVar87;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int pStore [32];
  int local_b8 [34];
  long lVar49;
  
  auVar26 = _DAT_0094e250;
  uVar24 = 1 << ((byte)nVars - 5 & 0x1f);
  if (nVars < 6) {
    uVar24 = 1;
  }
  if (0 < nVars) {
    lVar34 = (ulong)(uint)nVars - 1;
    auVar35._8_4_ = (int)lVar34;
    auVar35._0_8_ = lVar34;
    auVar35._12_4_ = (int)((ulong)lVar34 >> 0x20);
    uVar29 = 0;
    auVar36 = auVar35;
    auVar48 = _DAT_009c8570;
    auVar50 = _DAT_009c8580;
    auVar51 = _DAT_009c8590;
    auVar52 = _DAT_009c85a0;
    auVar53 = _DAT_009c85b0;
    auVar54 = _DAT_009c85c0;
    auVar55 = _DAT_0094f530;
    auVar56 = _DAT_0094e240;
    do {
      auVar66 = auVar35 ^ auVar26;
      auVar70 = auVar56 ^ auVar26;
      iVar45 = auVar66._0_4_;
      iVar83 = -(uint)(iVar45 < auVar70._0_4_);
      iVar47 = auVar66._4_4_;
      auVar72._4_4_ = -(uint)(iVar47 < auVar70._4_4_);
      iVar68 = auVar66._8_4_;
      iVar87 = -(uint)(iVar68 < auVar70._8_4_);
      iVar69 = auVar66._12_4_;
      auVar72._12_4_ = -(uint)(iVar69 < auVar70._12_4_);
      auVar66._4_4_ = iVar83;
      auVar66._0_4_ = iVar83;
      auVar66._8_4_ = iVar87;
      auVar66._12_4_ = iVar87;
      auVar66 = pshuflw(auVar36,auVar66,0xe8);
      auVar71._4_4_ = -(uint)(auVar70._4_4_ == iVar47);
      auVar71._12_4_ = -(uint)(auVar70._12_4_ == iVar69);
      auVar71._0_4_ = auVar71._4_4_;
      auVar71._8_4_ = auVar71._12_4_;
      auVar57 = pshuflw(in_XMM11,auVar71,0xe8);
      auVar72._0_4_ = auVar72._4_4_;
      auVar72._8_4_ = auVar72._12_4_;
      auVar70 = pshuflw(auVar66,auVar72,0xe8);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar70 | auVar57 & auVar66) ^ auVar36;
      auVar36 = packssdw(auVar36,auVar36);
      cVar28 = (char)uVar29;
      if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pCanonPerm[uVar29] = cVar28;
      }
      auVar57._4_4_ = iVar83;
      auVar57._0_4_ = iVar83;
      auVar57._8_4_ = iVar87;
      auVar57._12_4_ = iVar87;
      auVar72 = auVar71 & auVar57 | auVar72;
      auVar36 = packssdw(auVar72,auVar72);
      auVar70._8_4_ = 0xffffffff;
      auVar70._0_8_ = 0xffffffffffffffff;
      auVar70._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar70,auVar36 ^ auVar70);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 8 & 1) != 0) {
        pCanonPerm[uVar29 + 1] = cVar28 + '\x01';
      }
      auVar36 = auVar55 ^ auVar26;
      auVar58._0_4_ = -(uint)(iVar45 < auVar36._0_4_);
      auVar58._4_4_ = -(uint)(iVar47 < auVar36._4_4_);
      auVar58._8_4_ = -(uint)(iVar68 < auVar36._8_4_);
      auVar58._12_4_ = -(uint)(iVar69 < auVar36._12_4_);
      auVar73._4_4_ = auVar58._0_4_;
      auVar73._0_4_ = auVar58._0_4_;
      auVar73._8_4_ = auVar58._8_4_;
      auVar73._12_4_ = auVar58._8_4_;
      iVar83 = -(uint)(auVar36._4_4_ == iVar47);
      iVar87 = -(uint)(auVar36._12_4_ == iVar69);
      auVar11._4_4_ = iVar83;
      auVar11._0_4_ = iVar83;
      auVar11._8_4_ = iVar87;
      auVar11._12_4_ = iVar87;
      auVar84._4_4_ = auVar58._4_4_;
      auVar84._0_4_ = auVar58._4_4_;
      auVar84._8_4_ = auVar58._12_4_;
      auVar84._12_4_ = auVar58._12_4_;
      auVar36 = auVar11 & auVar73 | auVar84;
      auVar36 = packssdw(auVar36,auVar36);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar2,auVar36 ^ auVar2);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
        pCanonPerm[uVar29 + 2] = cVar28 + '\x02';
      }
      auVar36 = pshufhw(auVar36,auVar73,0x84);
      auVar12._4_4_ = iVar83;
      auVar12._0_4_ = iVar83;
      auVar12._8_4_ = iVar87;
      auVar12._12_4_ = iVar87;
      auVar70 = pshufhw(auVar58,auVar12,0x84);
      auVar66 = pshufhw(auVar36,auVar84,0x84);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar37 = (auVar66 | auVar70 & auVar36) ^ auVar37;
      auVar36 = packssdw(auVar37,auVar37);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 0x18 & 1) != 0) {
        pCanonPerm[uVar29 + 3] = cVar28 + '\x03';
      }
      auVar36 = auVar54 ^ auVar26;
      auVar59._0_4_ = -(uint)(iVar45 < auVar36._0_4_);
      auVar59._4_4_ = -(uint)(iVar47 < auVar36._4_4_);
      auVar59._8_4_ = -(uint)(iVar68 < auVar36._8_4_);
      auVar59._12_4_ = -(uint)(iVar69 < auVar36._12_4_);
      auVar13._4_4_ = auVar59._0_4_;
      auVar13._0_4_ = auVar59._0_4_;
      auVar13._8_4_ = auVar59._8_4_;
      auVar13._12_4_ = auVar59._8_4_;
      auVar70 = pshuflw(auVar84,auVar13,0xe8);
      auVar38._0_4_ = -(uint)(auVar36._0_4_ == iVar45);
      auVar38._4_4_ = -(uint)(auVar36._4_4_ == iVar47);
      auVar38._8_4_ = -(uint)(auVar36._8_4_ == iVar68);
      auVar38._12_4_ = -(uint)(auVar36._12_4_ == iVar69);
      auVar74._4_4_ = auVar38._4_4_;
      auVar74._0_4_ = auVar38._4_4_;
      auVar74._8_4_ = auVar38._12_4_;
      auVar74._12_4_ = auVar38._12_4_;
      auVar36 = pshuflw(auVar38,auVar74,0xe8);
      auVar75._4_4_ = auVar59._4_4_;
      auVar75._0_4_ = auVar59._4_4_;
      auVar75._8_4_ = auVar59._12_4_;
      auVar75._12_4_ = auVar59._12_4_;
      auVar66 = pshuflw(auVar59,auVar75,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 & auVar70,(auVar66 | auVar36 & auVar70) ^ auVar3);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pCanonPerm[uVar29 + 4] = cVar28 + '\x04';
      }
      auVar14._4_4_ = auVar59._0_4_;
      auVar14._0_4_ = auVar59._0_4_;
      auVar14._8_4_ = auVar59._8_4_;
      auVar14._12_4_ = auVar59._8_4_;
      auVar75 = auVar74 & auVar14 | auVar75;
      auVar66 = packssdw(auVar75,auVar75);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36,auVar66 ^ auVar4);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._4_2_ >> 8 & 1) != 0) {
        pCanonPerm[uVar29 + 5] = cVar28 + '\x05';
      }
      auVar36 = auVar53 ^ auVar26;
      auVar60._0_4_ = -(uint)(iVar45 < auVar36._0_4_);
      auVar60._4_4_ = -(uint)(iVar47 < auVar36._4_4_);
      auVar60._8_4_ = -(uint)(iVar68 < auVar36._8_4_);
      auVar60._12_4_ = -(uint)(iVar69 < auVar36._12_4_);
      auVar76._4_4_ = auVar60._0_4_;
      auVar76._0_4_ = auVar60._0_4_;
      auVar76._8_4_ = auVar60._8_4_;
      auVar76._12_4_ = auVar60._8_4_;
      iVar83 = -(uint)(auVar36._4_4_ == iVar47);
      iVar87 = -(uint)(auVar36._12_4_ == iVar69);
      auVar15._4_4_ = iVar83;
      auVar15._0_4_ = iVar83;
      auVar15._8_4_ = iVar87;
      auVar15._12_4_ = iVar87;
      auVar85._4_4_ = auVar60._4_4_;
      auVar85._0_4_ = auVar60._4_4_;
      auVar85._8_4_ = auVar60._12_4_;
      auVar85._12_4_ = auVar60._12_4_;
      auVar36 = auVar15 & auVar76 | auVar85;
      auVar36 = packssdw(auVar36,auVar36);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar5,auVar36 ^ auVar5);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pCanonPerm[uVar29 + 6] = cVar28 + '\x06';
      }
      auVar36 = pshufhw(auVar36,auVar76,0x84);
      auVar16._4_4_ = iVar83;
      auVar16._0_4_ = iVar83;
      auVar16._8_4_ = iVar87;
      auVar16._12_4_ = iVar87;
      auVar70 = pshufhw(auVar60,auVar16,0x84);
      auVar66 = pshufhw(auVar36,auVar85,0x84);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar66 | auVar70 & auVar36) ^ auVar39;
      auVar36 = packssdw(auVar39,auVar39);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._6_2_ >> 8 & 1) != 0) {
        pCanonPerm[uVar29 + 7] = cVar28 + '\a';
      }
      auVar36 = auVar52 ^ auVar26;
      auVar61._0_4_ = -(uint)(iVar45 < auVar36._0_4_);
      auVar61._4_4_ = -(uint)(iVar47 < auVar36._4_4_);
      auVar61._8_4_ = -(uint)(iVar68 < auVar36._8_4_);
      auVar61._12_4_ = -(uint)(iVar69 < auVar36._12_4_);
      auVar17._4_4_ = auVar61._0_4_;
      auVar17._0_4_ = auVar61._0_4_;
      auVar17._8_4_ = auVar61._8_4_;
      auVar17._12_4_ = auVar61._8_4_;
      auVar70 = pshuflw(auVar85,auVar17,0xe8);
      auVar40._0_4_ = -(uint)(auVar36._0_4_ == iVar45);
      auVar40._4_4_ = -(uint)(auVar36._4_4_ == iVar47);
      auVar40._8_4_ = -(uint)(auVar36._8_4_ == iVar68);
      auVar40._12_4_ = -(uint)(auVar36._12_4_ == iVar69);
      auVar77._4_4_ = auVar40._4_4_;
      auVar77._0_4_ = auVar40._4_4_;
      auVar77._8_4_ = auVar40._12_4_;
      auVar77._12_4_ = auVar40._12_4_;
      auVar36 = pshuflw(auVar40,auVar77,0xe8);
      auVar78._4_4_ = auVar61._4_4_;
      auVar78._0_4_ = auVar61._4_4_;
      auVar78._8_4_ = auVar61._12_4_;
      auVar78._12_4_ = auVar61._12_4_;
      auVar66 = pshuflw(auVar61,auVar78,0xe8);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar62 = (auVar66 | auVar36 & auVar70) ^ auVar62;
      auVar66 = packssdw(auVar62,auVar62);
      auVar36 = packsswb(auVar36 & auVar70,auVar66);
      if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pCanonPerm[uVar29 + 8] = cVar28 + '\b';
      }
      auVar18._4_4_ = auVar61._0_4_;
      auVar18._0_4_ = auVar61._0_4_;
      auVar18._8_4_ = auVar61._8_4_;
      auVar18._12_4_ = auVar61._8_4_;
      auVar78 = auVar77 & auVar18 | auVar78;
      auVar66 = packssdw(auVar78,auVar78);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar66 = packssdw(auVar66 ^ auVar6,auVar66 ^ auVar6);
      auVar36 = packsswb(auVar36,auVar66);
      if ((auVar36._8_2_ >> 8 & 1) != 0) {
        pCanonPerm[uVar29 + 9] = cVar28 + '\t';
      }
      auVar36 = auVar51 ^ auVar26;
      auVar63._0_4_ = -(uint)(iVar45 < auVar36._0_4_);
      auVar63._4_4_ = -(uint)(iVar47 < auVar36._4_4_);
      auVar63._8_4_ = -(uint)(iVar68 < auVar36._8_4_);
      auVar63._12_4_ = -(uint)(iVar69 < auVar36._12_4_);
      auVar79._4_4_ = auVar63._0_4_;
      auVar79._0_4_ = auVar63._0_4_;
      auVar79._8_4_ = auVar63._8_4_;
      auVar79._12_4_ = auVar63._8_4_;
      iVar83 = -(uint)(auVar36._4_4_ == iVar47);
      iVar87 = -(uint)(auVar36._12_4_ == iVar69);
      auVar19._4_4_ = iVar83;
      auVar19._0_4_ = iVar83;
      auVar19._8_4_ = iVar87;
      auVar19._12_4_ = iVar87;
      auVar86._4_4_ = auVar63._4_4_;
      auVar86._0_4_ = auVar63._4_4_;
      auVar86._8_4_ = auVar63._12_4_;
      auVar86._12_4_ = auVar63._12_4_;
      auVar36 = auVar19 & auVar79 | auVar86;
      auVar36 = packssdw(auVar36,auVar36);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar7,auVar36 ^ auVar7);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pCanonPerm[uVar29 + 10] = cVar28 + '\n';
      }
      auVar36 = pshufhw(auVar36,auVar79,0x84);
      auVar20._4_4_ = iVar83;
      auVar20._0_4_ = iVar83;
      auVar20._8_4_ = iVar87;
      auVar20._12_4_ = iVar87;
      auVar70 = pshufhw(auVar63,auVar20,0x84);
      auVar66 = pshufhw(auVar36,auVar86,0x84);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar41 = (auVar66 | auVar70 & auVar36) ^ auVar41;
      auVar36 = packssdw(auVar41,auVar41);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._10_2_ >> 8 & 1) != 0) {
        pCanonPerm[uVar29 + 0xb] = cVar28 + '\v';
      }
      auVar36 = auVar50 ^ auVar26;
      auVar64._0_4_ = -(uint)(iVar45 < auVar36._0_4_);
      auVar64._4_4_ = -(uint)(iVar47 < auVar36._4_4_);
      auVar64._8_4_ = -(uint)(iVar68 < auVar36._8_4_);
      auVar64._12_4_ = -(uint)(iVar69 < auVar36._12_4_);
      auVar21._4_4_ = auVar64._0_4_;
      auVar21._0_4_ = auVar64._0_4_;
      auVar21._8_4_ = auVar64._8_4_;
      auVar21._12_4_ = auVar64._8_4_;
      auVar70 = pshuflw(auVar86,auVar21,0xe8);
      auVar42._0_4_ = -(uint)(auVar36._0_4_ == iVar45);
      auVar42._4_4_ = -(uint)(auVar36._4_4_ == iVar47);
      auVar42._8_4_ = -(uint)(auVar36._8_4_ == iVar68);
      auVar42._12_4_ = -(uint)(auVar36._12_4_ == iVar69);
      auVar80._4_4_ = auVar42._4_4_;
      auVar80._0_4_ = auVar42._4_4_;
      auVar80._8_4_ = auVar42._12_4_;
      auVar80._12_4_ = auVar42._12_4_;
      auVar36 = pshuflw(auVar42,auVar80,0xe8);
      auVar81._4_4_ = auVar64._4_4_;
      auVar81._0_4_ = auVar64._4_4_;
      auVar81._8_4_ = auVar64._12_4_;
      auVar81._12_4_ = auVar64._12_4_;
      auVar66 = pshuflw(auVar64,auVar81,0xe8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 & auVar70,(auVar66 | auVar36 & auVar70) ^ auVar8);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pCanonPerm[uVar29 + 0xc] = cVar28 + '\f';
      }
      auVar22._4_4_ = auVar64._0_4_;
      auVar22._0_4_ = auVar64._0_4_;
      auVar22._8_4_ = auVar64._8_4_;
      auVar22._12_4_ = auVar64._8_4_;
      auVar81 = auVar80 & auVar22 | auVar81;
      auVar66 = packssdw(auVar81,auVar81);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36,auVar66 ^ auVar9);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._12_2_ >> 8 & 1) != 0) {
        pCanonPerm[uVar29 + 0xd] = cVar28 + '\r';
      }
      auVar36 = auVar48 ^ auVar26;
      auVar65._0_4_ = -(uint)(iVar45 < auVar36._0_4_);
      auVar65._4_4_ = -(uint)(iVar47 < auVar36._4_4_);
      auVar65._8_4_ = -(uint)(iVar68 < auVar36._8_4_);
      auVar65._12_4_ = -(uint)(iVar69 < auVar36._12_4_);
      auVar82._4_4_ = auVar65._0_4_;
      auVar82._0_4_ = auVar65._0_4_;
      auVar82._8_4_ = auVar65._8_4_;
      auVar82._12_4_ = auVar65._8_4_;
      iVar45 = -(uint)(auVar36._4_4_ == iVar47);
      iVar47 = -(uint)(auVar36._12_4_ == iVar69);
      auVar67._4_4_ = iVar45;
      auVar67._0_4_ = iVar45;
      auVar67._8_4_ = iVar47;
      auVar67._12_4_ = iVar47;
      auVar43._4_4_ = auVar65._4_4_;
      auVar43._0_4_ = auVar65._4_4_;
      auVar43._8_4_ = auVar65._12_4_;
      auVar43._12_4_ = auVar65._12_4_;
      auVar43 = auVar67 & auVar82 | auVar43;
      auVar36 = packssdw(auVar43,auVar43);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar10,auVar36 ^ auVar10);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pCanonPerm[uVar29 + 0xe] = cVar28 + '\x0e';
      }
      auVar36 = pshufhw(auVar36,auVar82,0x84);
      auVar66 = pshufhw(auVar65,auVar67,0x84);
      in_XMM11 = auVar66 & auVar36;
      auVar23._4_4_ = auVar65._4_4_;
      auVar23._0_4_ = auVar65._4_4_;
      auVar23._8_4_ = auVar65._12_4_;
      auVar23._12_4_ = auVar65._12_4_;
      auVar36 = pshufhw(auVar36,auVar23,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar36 | in_XMM11) ^ auVar44;
      auVar36 = packssdw(auVar44,auVar44);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._14_2_ >> 8 & 1) != 0) {
        pCanonPerm[uVar29 + 0xf] = cVar28 + '\x0f';
      }
      uVar29 = uVar29 + 0x10;
      lVar34 = (long)DAT_009c85d0;
      lVar49 = auVar56._8_8_;
      auVar56._0_8_ = auVar56._0_8_ + lVar34;
      lVar46 = DAT_009c85d0._8_8_;
      auVar56._8_8_ = lVar49 + lVar46;
      lVar49 = auVar55._8_8_;
      auVar55._0_8_ = auVar55._0_8_ + lVar34;
      auVar55._8_8_ = lVar49 + lVar46;
      lVar49 = auVar54._8_8_;
      auVar54._0_8_ = auVar54._0_8_ + lVar34;
      auVar54._8_8_ = lVar49 + lVar46;
      lVar49 = auVar53._8_8_;
      auVar53._0_8_ = auVar53._0_8_ + lVar34;
      auVar53._8_8_ = lVar49 + lVar46;
      lVar49 = auVar52._8_8_;
      auVar52._0_8_ = auVar52._0_8_ + lVar34;
      auVar52._8_8_ = lVar49 + lVar46;
      lVar49 = auVar51._8_8_;
      auVar51._0_8_ = auVar51._0_8_ + lVar34;
      auVar51._8_8_ = lVar49 + lVar46;
      lVar49 = auVar50._8_8_;
      auVar50._0_8_ = auVar50._0_8_ + lVar34;
      auVar50._8_8_ = lVar49 + lVar46;
      lVar49 = auVar48._8_8_;
      auVar48._0_8_ = auVar48._0_8_ + lVar34;
      auVar48._8_8_ = lVar49 + lVar46;
      auVar36 = _DAT_009c85d0;
    } while ((nVars + 0xfU & 0xfffffff0) != uVar29);
  }
  uVar29 = (ulong)uVar24;
  if (0 < (int)uVar24) {
    uVar30 = uVar29 + 1;
    iVar45 = 0;
    do {
      uVar32 = (pInOut[uVar30 - 2] >> 1 & 0x55555555) + (pInOut[uVar30 - 2] & 0x55555555);
      uVar32 = (uVar32 >> 2 & 0x33333333) + (uVar32 & 0x33333333);
      uVar32 = (uVar32 >> 4 & 0x7070707) + (uVar32 & 0x7070707);
      uVar32 = (uVar32 >> 8 & 0xf000f) + (uVar32 & 0xf000f);
      iVar45 = iVar45 + (uVar32 >> 0x10) + (uVar32 & 0xffff);
      uVar30 = uVar30 - 1;
    } while (1 < uVar30);
    uVar32 = 0;
    if (iVar45 == uVar24 * 0x10 ||
        SBORROW4(iVar45,uVar24 * 0x10) != (int)(iVar45 + uVar24 * -0x10) < 0) goto LAB_005e7c51;
    uVar30 = uVar29 + 1;
    do {
      pInOut[uVar30 - 2] = ~pInOut[uVar30 - 2];
      uVar30 = uVar30 - 1;
    } while (1 < uVar30);
  }
  uVar32 = 1 << ((byte)nVars & 0x1f);
LAB_005e7c51:
  Kit_TruthCountOnesInCofs(pInOut,nVars,local_b8);
  if (0 < nVars) {
    uVar30 = 0;
    do {
      iVar45 = local_b8[uVar30 * 2];
      if (iVar45 < local_b8[uVar30 * 2 + 1]) {
        uVar32 = uVar32 | 1 << ((uint)uVar30 & 0x1f);
        local_b8[uVar30 * 2] = local_b8[uVar30 * 2 + 1];
        local_b8[uVar30 * 2 + 1] = iVar45;
        Kit_TruthChangePhase(pInOut,nVars,(uint)uVar30);
      }
      uVar30 = uVar30 + 1;
    } while ((uint)nVars != uVar30);
  }
  bVar33 = false;
  do {
    if (nVars < 2) break;
    uVar30 = 0;
    bVar25 = false;
    pIn = pInOut;
    do {
      iVar45 = local_b8[uVar30 * 2];
      iVar47 = local_b8[uVar30 * 2 + 2];
      pInOut = pIn;
      if (iVar45 < iVar47) {
        puVar1 = (ushort *)(pCanonPerm + uVar30);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        local_b8[uVar30 * 2] = iVar47;
        local_b8[uVar30 * 2 + 2] = iVar45;
        iVar45 = local_b8[uVar30 * 2 + 1];
        uVar31 = uVar32 >> ((byte)uVar30 & 0x1f);
        local_b8[uVar30 * 2 + 1] = local_b8[uVar30 * 2 + 3];
        local_b8[uVar30 * 2 + 3] = iVar45;
        uVar27 = 0;
        if ((((uVar31 & 2) == 0 ^ (byte)uVar31) & 1) == 0) {
          uVar27 = 3 << ((byte)uVar30 & 0x1f);
        }
        bVar33 = (bool)(bVar33 ^ 1);
        uVar32 = uVar32 ^ uVar27;
        Kit_TruthSwapAdjacentVars(pAux,pIn,nVars,(int)uVar30);
        bVar25 = true;
        pInOut = pAux;
        pAux = pIn;
      }
      uVar30 = uVar30 + 1;
      pIn = pInOut;
    } while (nVars - 1 != uVar30);
  } while (bVar25);
  if ((0 < (int)uVar24) && (bVar33)) {
    uVar29 = uVar29 + 1;
    do {
      pAux[uVar29 - 2] = pInOut[uVar29 - 2];
      uVar29 = uVar29 - 1;
    } while (1 < uVar29);
  }
  return uVar32;
}

Assistant:

unsigned Kit_TruthSemiCanonicize( unsigned * pInOut, unsigned * pAux, int nVars, char * pCanonPerm )
{
    int pStore[32];
    unsigned * pIn = pInOut, * pOut = pAux, * pTemp;
    int nWords = Kit_TruthWordNum( nVars );
    int i, Temp, fChange, Counter, nOnes;//, k, j, w, Limit;
    unsigned uCanonPhase;

    // canonicize output
    uCanonPhase = 0;
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;

    nOnes = Kit_TruthCountOnes(pIn, nVars);
    //if(pIn[0] & 1)
    if ( (nOnes > nWords * 16) )//|| ((nOnes == nWords * 16) && (pIn[0] & 1)) )
    {
        uCanonPhase |= (1 << nVars);
        Kit_TruthNot( pIn, pIn, nVars );
    }

    // collect the minterm counts
    Kit_TruthCountOnesInCofs( pIn, nVars, pStore );
/*
    Kit_TruthCountOnesInCofsSlow( pIn, nVars, pStore2, pAux );
    for ( i = 0; i < 2*nVars; i++ )
    {
        assert( pStore[i] == pStore2[i] );
    }
*/
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] >= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        Kit_TruthChangePhase( pIn, nVars, i );
    }

//    Kit_PrintHexadecimal( stdout, pIn, nVars );
//    printf( "\n" );

    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] >= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            // if the polarity of variables is different, swap them
            if ( ((uCanonPhase & (1 << i)) > 0) != ((uCanonPhase & (1 << (i+1))) > 0) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << (i+1));
            }

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );


/*
    Extra_PrintBinary( stdout, &uCanonPhase, nVars+1 ); printf( " : " );
    for ( i = 0; i < nVars; i++ )
        printf( "%d=%d/%d  ", pCanonPerm[i], pStore[2*i], pStore[2*i+1] );
    printf( "  C = %d\n", Counter );
    Extra_PrintHexadecimal( stdout, pIn, nVars );
    printf( "\n" );
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        if ( pStore[2*i] != pStore[2*i+1] )
            continue;
        if ( Kit_TruthVarsSymm( pIn, nVars, i, i+1 ) )
            continue;
        if ( Kit_TruthVarsAntiSymm( pIn, nVars, i, i+1 ) )
            Kit_TruthChangePhase( pIn, nVars, i+1 );
    }
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        // i and i+1 can be symmetric
        // find the end of this group
        for ( k = i+1; k < nVars; k++ )
            if ( pStore[2*i] != pStore[2*k] ) 
                break;
        Limit = k;
        assert( i < Limit-1 );
        // go through the variables in this group
        for ( j = i + 1; j < Limit; j++ )
        {
            // check symmetry
            if ( Kit_TruthVarsSymm( pIn, nVars, i, j ) )
            {
                uSymms |= (1 << j);
                continue;
            }
            // they are phase-unknown
            if ( pStore[2*i] == pStore[2*i+1] ) 
            {
                if ( Kit_TruthVarsAntiSymm( pIn, nVars, i, j ) )
                {
                    Kit_TruthChangePhase( pIn, nVars, j );
                    uCanonPhase ^= (1 << j);
                    uSymms |= (1 << j);
                    continue;
                }
            }

            // they are not symmetric - move j as far as it goes in the group
            for ( k = j; k < Limit-1; k++ )
            {
                Counter++;

                Temp = pCanonPerm[k];
                pCanonPerm[k] = pCanonPerm[k+1];
                pCanonPerm[k+1] = Temp;

                assert( pStore[2*k] == pStore[2*(k+1)] );
                Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
            }
            Limit--;
            j--;
        }
        i = Limit - 1;
    }
*/

    // swap if it was moved an even number of times
    if ( Counter & 1 )
        Kit_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}